

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

void wasm::Path::setBinaryenBinDir(string *dir)

{
  std::__cxx11::string::_M_assign((string *)&binDir_abi_cxx11_);
  if ((DAT_010b2248 != 0) && (*(char *)(binDir_abi_cxx11_ + -1 + DAT_010b2248) == '/')) {
    return;
  }
  std::__cxx11::string::push_back('@');
  return;
}

Assistant:

void setBinaryenBinDir(const std::string& dir) {
  binDir = dir;
  if (binDir.empty() || binDir.back() != getPathSeparator()) {
    binDir += getPathSeparator();
  }
}